

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O0

int NgramBuilder_serialize(NgramBuilder builder,Serializer serializer,void *param)

{
  size_t sVar1;
  uint local_584;
  undefined1 local_580 [4];
  uint32_t i_3;
  BuilderGram_T gram_1;
  BuilderGram_T cur_gram;
  uint32_t cur_order_1;
  uint32_t cur_order;
  size_t next_order_offsets [64];
  size_t cur_offset;
  undefined1 local_148 [4];
  uint32_t i_2;
  BuilderGram_T gram;
  size_t vocab_mem_size;
  uint32_t i_1;
  uint32_t i;
  void *param_local;
  Serializer serializer_local;
  NgramBuilder builder_local;
  
  vocab_mem_size._4_4_ = 0;
  while( true ) {
    if (builder->order <= vocab_mem_size._4_4_) {
      (*serializer)((char *)&builder->order,4,param);
      for (vocab_mem_size._0_4_ = 0; (uint)vocab_mem_size < builder->order;
          vocab_mem_size._0_4_ = (uint)vocab_mem_size + 1) {
        (*serializer)((char *)(builder->gram_nums + (uint)vocab_mem_size),8,param);
      }
      gram._264_8_ = HashVocab_serialize_size(builder->vocab);
      (*serializer)((char *)&gram.bow,8,param);
      HashVocab_serialize(builder->vocab,serializer,param);
      qsort(builder->ngram_offsets,builder->added_total_gram_num,8,ngram_sort_cmp);
      if (builder->order == 1) {
        for (cur_offset._4_4_ = 0; (ulong)cur_offset._4_4_ < *builder->gram_nums;
            cur_offset._4_4_ = cur_offset._4_4_ + 1) {
          _decode_builder_gram((BuilderGram_T *)local_148,builder->ngram_offsets[cur_offset._4_4_]);
          local_148 = (undefined1  [4])0xffffffff;
          serialize_builder_gram((BuilderGram_T *)local_148,builder->order,serializer,param);
        }
        gram.wids[0x3f] = 0xffffffff;
        gram.wids[0x3e] = 0xffffffff;
        serialize_builder_gram((BuilderGram_T *)local_148,builder->order,serializer,param);
      }
      else {
        next_order_offsets[0x3f] = 0;
        _cur_order_1 = 0;
        for (cur_gram.order = 1; cur_gram.order < builder->order;
            cur_gram.order = cur_gram.order + 1) {
          sVar1 = _bsearch_order_start
                            (builder->ngram_offsets,builder->added_total_gram_num,cur_gram.order + 1
                            );
          *(size_t *)(&cur_order_1 + (ulong)cur_gram.order * 2) = sVar1;
        }
        *(size_t *)(&cur_order_1 + (ulong)builder->order * 2) = builder->added_total_gram_num;
        for (cur_gram.bow = 1; cur_gram.bow < builder->order; cur_gram.bow = cur_gram.bow + 1) {
          for (; next_order_offsets[0x3f] < *(ulong *)(&cur_order_1 + (ulong)cur_gram.bow * 2);
              next_order_offsets[0x3f] = next_order_offsets[0x3f] + 1) {
            _decode_builder_gram
                      ((BuilderGram_T *)&gram_1.bow,builder->ngram_offsets[next_order_offsets[0x3f]]
                      );
            if (cur_gram.prob != cur_gram.bow) {
              __assert_fail("cur_gram.order == cur_order",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c"
                            ,0x28c,
                            "int NgramBuilder_serialize(const NgramBuilder, Serializer, void *)");
            }
            sVar1 = _bsearch_prefix_start
                              (builder->ngram_offsets,builder->added_total_gram_num,
                               (BuilderGram_T *)&gram_1.bow);
            gram_1.bow = (int)sVar1 - (int)*(undefined8 *)(&cur_order_1 + (ulong)cur_gram.bow * 2);
            serialize_builder_gram((BuilderGram_T *)&gram_1.bow,builder->order,serializer,param);
          }
          cur_gram.wids[(ulong)(cur_gram.bow - 1) - 2] = 0xffffffff;
          cur_gram.prob = cur_gram.bow;
          gram_1.bow = (int)*(undefined8 *)(&cur_order_1 + (ulong)(cur_gram.bow + 1) * 2) -
                       (int)*(undefined8 *)(&cur_order_1 + (ulong)cur_gram.bow * 2);
          serialize_builder_gram((BuilderGram_T *)&gram_1.bow,builder->order,serializer,param);
        }
        if (1 < builder->order) {
          gram_1.prob = builder->order;
          for (local_584 = (uint)*(undefined8 *)(&cur_order_1 + (ulong)(builder->order - 1) * 2);
              (ulong)local_584 < builder->added_total_gram_num; local_584 = local_584 + 1) {
            _decode_builder_gram((BuilderGram_T *)local_580,builder->ngram_offsets[local_584]);
            local_580 = (undefined1  [4])0xffffffff;
            serialize_builder_gram((BuilderGram_T *)local_580,builder->order,serializer,param);
          }
          gram_1.wids[0x3f] = 0xffffffff;
          gram_1.wids[0x3e] = 0xffffffff;
          gram_1.wids[(ulong)(builder->order - 1) - 2] = 0xffffffff;
          serialize_builder_gram((BuilderGram_T *)local_580,builder->order,serializer,param);
        }
      }
      return 0;
    }
    if (builder->added_gram_nums[vocab_mem_size._4_4_] != builder->gram_nums[vocab_mem_size._4_4_])
    break;
    vocab_mem_size._4_4_ = vocab_mem_size._4_4_ + 1;
  }
  __assert_fail("builder->added_gram_nums[i] == builder->gram_nums[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c",
                0x261,"int NgramBuilder_serialize(const NgramBuilder, Serializer, void *)");
}

Assistant:

int NgramBuilder_serialize(const NgramBuilder builder, Serializer serializer, void* param){
    for (uint32_t i = 0;i<builder->order;i++) {
        assert(builder->added_gram_nums[i] == builder->gram_nums[i]);
    }
    serializer((char*)&builder->order,sizeof(uint32_t), param);
    for (uint32_t i = 0; i < builder->order;i++) {
        serializer((char*)&builder->gram_nums[i],sizeof(size_t), param);
    }
    size_t vocab_mem_size = HashVocab_serialize_size(builder->vocab);
    //printf("serialize vocab_mem_size:%zu\n", vocab_mem_size);
    serializer((char*)&vocab_mem_size,sizeof(vocab_mem_size), param);
    HashVocab_serialize(builder->vocab, serializer, param);

    qsort(builder->ngram_offsets, builder->added_total_gram_num, sizeof(char*), ngram_sort_cmp);
    //now sorted by order, wordids
    //print_ngrams(builder->ngram_offsets, builder->added_total_gram_num);

    if (builder->order == 1) {
        BuilderGram_T gram;
        for (uint32_t i = 0;i< builder->gram_nums[0];i++) {
            _decode_builder_gram(&gram, builder->ngram_offsets[i]);
            gram.next_arr_idx = -1;
            serialize_builder_gram(&gram, builder->order, serializer ,param);
        }
        gram.bow = -1;
        gram.prob = -1;
        serialize_builder_gram(&gram, builder->order, serializer, param);//pivot.
        return 0;
    }
    size_t cur_offset = 0;
    size_t next_order_offsets[MAX_ORDER];
    next_order_offsets[0] = 0;
    for (uint32_t cur_order = 1; cur_order< builder->order;cur_order++) {
        next_order_offsets[cur_order] = _bsearch_order_start(builder->ngram_offsets, builder->added_total_gram_num, cur_order+1);
        //printf("serialize: next_order_offsets[%d]= %zu\n", cur_order, next_order_offsets[cur_order]);
    }

    next_order_offsets[builder->order] = builder->added_total_gram_num;

    for (uint32_t cur_order = 1; cur_order < builder->order; cur_order++) {
        BuilderGram_T cur_gram;
        while (cur_offset < next_order_offsets[cur_order]) {
            _decode_builder_gram(&cur_gram, builder->ngram_offsets[cur_offset]);
            //printf("cur_order:%d\n", cur_order);
            //printf("cur_gram.order:%d\n", cur_gram.order);
            assert(cur_gram.order == cur_order);
            cur_gram.next_arr_idx = _bsearch_prefix_start(builder->ngram_offsets, builder->added_total_gram_num, &cur_gram) - next_order_offsets[cur_order];
            //if (cur_order == 1) {
            //    printf("id:%d\t", cur_offset);
            //}
            serialize_builder_gram(&cur_gram, builder->order, serializer, param); 
            cur_offset += 1;
        }
        cur_gram.wids[cur_order-1] = -1;
        cur_gram.order = cur_order;
        cur_gram.prob = -1;
        cur_gram.bow = -1;
        cur_gram.next_arr_idx = next_order_offsets[cur_order+1] - next_order_offsets[cur_order];
        serialize_builder_gram(&cur_gram, builder->order, serializer, param);
    }
    if (builder->order > 1) {
        BuilderGram_T gram;
        gram.order = builder->order;
        for (uint32_t i =  next_order_offsets[builder->order-1];i< builder->added_total_gram_num;i++) {
            _decode_builder_gram(&gram, builder->ngram_offsets[i]);
            gram.next_arr_idx = -1;
            serialize_builder_gram(&gram, builder->order, serializer, param);
        }
        gram.bow = -1;
        gram.prob = -1;
        gram.wids[builder->order-1] = -1;
        serialize_builder_gram(&gram, builder->order, serializer, param);//pivot.
    }
    return 0; 
}